

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

uchar * __thiscall
QResourceFileEnginePrivate::map
          (QResourceFileEnginePrivate *this,qint64 offset,qint64 size,MemoryMapFlags flags)

{
  bool bVar1;
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar2;
  QResourceFileEngine *pQVar3;
  qint64 qVar4;
  const_iterator pcVar5;
  long in_RDX;
  long in_RSI;
  QResourceFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  uchar *address;
  qint64 max;
  QResourceFileEngine *q;
  qint64 end;
  MemoryMapFlag in_stack_ffffffffffffff5c;
  QResourceFileEnginePrivate *in_stack_ffffffffffffff60;
  QAbstractFileEngine *this_00;
  uchar *local_80;
  uchar *local_40;
  QFlagsStorageHelper<QFileDevice::MemoryMapFlag,_4> local_34;
  QAbstractFileEngine local_30;
  undefined1 *local_18 [2];
  long local_8;
  FileError error;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  error = (FileError)((ulong)pQVar3 >> 0x20);
  qVar4 = QResource::uncompressedSize((QResource *)in_stack_ffffffffffffff60);
  local_18[0] = &DAT_aaaaaaaaaaaaaaaa;
  if ((((in_RSI < 0) || (in_RDX < 1)) ||
      (bVar1 = QResource::isValid((QResource *)in_stack_ffffffffffffff60), !bVar1)) ||
     ((eVar2 = qAddOverflow<long_long>(in_RSI,in_RDX,(longlong *)local_18), eVar2 ||
      (qVar4 < (long)local_18[0])))) {
    this_00 = &local_30;
    QString::QString((QString *)0x2ea9c2);
    QAbstractFileEngine::setError(this_00,error,(QString *)in_stack_ffffffffffffff60);
    QString::~QString((QString *)0x2ea9e2);
    local_40 = (uchar *)0x0;
  }
  else {
    pcVar5 = QByteArray::constBegin((QByteArray *)0x2eaa1f);
    bVar1 = QByteArray::isNull((QByteArray *)0x2eaa32);
    if (bVar1) {
      local_80 = QResource::data((QResource *)in_stack_ffffffffffffff60);
      local_34.super_QFlagsStorage<QFileDevice::MemoryMapFlag>.i =
           (QFlagsStorage<QFileDevice::MemoryMapFlag>)
           QFlags<QFileDevice::MemoryMapFlag>::operator&
                     ((QFlags<QFileDevice::MemoryMapFlag> *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_34);
      if (bVar1) {
        mapUncompressed(in_stack_ffffffffffffff60);
        local_80 = (uchar *)QByteArray::constData((QByteArray *)0x2eaa98);
      }
      local_40 = local_80 + in_RSI;
    }
    else {
      local_40 = (uchar *)(pcVar5 + in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

uchar *QResourceFileEnginePrivate::map(qint64 offset, qint64 size, QFile::MemoryMapFlags flags)
{
    Q_Q(QResourceFileEngine);
    Q_ASSERT_X(resource.compressionAlgorithm() == QResource::NoCompression
               || !uncompressed.isNull(), "QFile::map()",
               "open() should have uncompressed compressed resources");

    qint64 max = resource.uncompressedSize();
    qint64 end;
    if (offset < 0 || size <= 0 || !resource.isValid() ||
            qAddOverflow(offset, size, &end) || end > max) {
        q->setError(QFile::UnspecifiedError, QString());
        return nullptr;
    }

    const uchar *address = reinterpret_cast<const uchar *>(uncompressed.constBegin());
    if (!uncompressed.isNull())
        return const_cast<uchar *>(address) + offset;

    // resource was not compressed
    address = resource.data();
    if (flags & QFile::MapPrivateOption) {
        // We need to provide read-write memory
        mapUncompressed();
        address = reinterpret_cast<const uchar *>(uncompressed.constData());
    }

    return const_cast<uchar *>(address) + offset;
}